

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegisterAllocation.cpp
# Opt level: O3

int getColorForTemp(string *temp,
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                   *recoveredGraph,
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   *tempToColorMap)

{
  _Rb_tree_color _Var1;
  _Base_ptr p_Var2;
  mapped_type *pmVar3;
  iterator iVar4;
  mapped_type *__v;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  int iVar7;
  _Base_ptr p_Var8;
  _Rb_tree_header *p_Var9;
  string neighbour;
  set<int,_std::less<int>,_std::allocator<int>_> colorSet;
  key_type local_80;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
           ::operator[](recoveredGraph,temp);
  p_Var5 = (pmVar3->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var9 = &(pmVar3->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var5 != p_Var9) {
    do {
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_80,*(long *)(p_Var5 + 1),
                 (long)&(p_Var5[1]._M_parent)->_M_color + *(long *)(p_Var5 + 1));
      iVar4 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              ::find(&tempToColorMap->_M_t,&local_80);
      if ((_Rb_tree_header *)iVar4._M_node == &(tempToColorMap->_M_t)._M_impl.super__Rb_tree_header)
      {
        __assert_fail("tempToColorMap.find(neighbour) != tempToColorMap.end()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/IRT/register_allocation/RegisterAllocation.cpp"
                      ,0x6e,
                      "int getColorForTemp(const std::string &, std::map<std::string, std::set<std::string>> &, std::map<std::string, int> &)"
                     );
      }
      __v = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ::operator[](tempToColorMap,&local_80);
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &local_60,__v);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p);
      }
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    } while ((_Rb_tree_header *)p_Var5 != p_Var9);
  }
  iVar7 = 0;
  if (local_60._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var9 = &local_60._M_impl.super__Rb_tree_header;
    p_Var5 = &p_Var9->_M_header;
    p_Var2 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
    while( true ) {
      do {
        p_Var6 = p_Var2;
        p_Var8 = p_Var5;
        _Var1 = p_Var6[1]._M_color;
        p_Var5 = p_Var6;
        if ((int)_Var1 < iVar7) {
          p_Var5 = p_Var8;
        }
        p_Var2 = (&p_Var6->_M_left)[(int)_Var1 < iVar7];
      } while ((&p_Var6->_M_left)[(int)_Var1 < iVar7] != (_Base_ptr)0x0);
      if ((_Rb_tree_header *)p_Var5 == p_Var9) break;
      if ((int)_Var1 < iVar7) {
        p_Var6 = p_Var8;
      }
      if (iVar7 < (int)p_Var6[1]._M_color) break;
      iVar7 = iVar7 + 1;
      p_Var5 = &p_Var9->_M_header;
      p_Var2 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
    }
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_60);
  return iVar7;
}

Assistant:

int getColorForTemp(const std::string& temp,
                    std::map<std::string, std::set<std::string>>& recoveredGraph,
                    std::map<std::string, int>& tempToColorMap) {

    std::set<int> colorSet;
    for (std::string neighbour : recoveredGraph[temp]) {
        assert(tempToColorMap.find(neighbour) != tempToColorMap.end());
        colorSet.insert(tempToColorMap[neighbour]);
    }

    int color = 0;
    while (colorSet.find(color) != colorSet.end()) {
        ++color;
    }

    return color;
}